

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O3

TextureBindingSp __thiscall
vkt::sr::anon_unknown_0::TextureGather2DInstance::createTexture(TextureGather2DInstance *this)

{
  ostringstream *this_00;
  TextureFormat TVar1;
  TextureGather2DInstance *pTVar2;
  TextureFormat TVar3;
  int iVar4;
  deUint32 seed;
  Texture2D *pTVar5;
  long *plVar6;
  pointer pPVar7;
  TextureBinding *this_01;
  Context *pCVar8;
  size_type *psVar9;
  ConstPixelBufferAccess *access;
  pointer pPVar10;
  void *__buf;
  SharedPtrStateBase *extraout_RDX;
  int levelNdx;
  long in_RSI;
  long lVar11;
  long lVar12;
  long lVar13;
  TextureBindingSp TVar14;
  MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> texture;
  TextureFormatInfo texFmtInfo;
  UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> local_4e0;
  int local_4cc;
  string local_4c8;
  string local_4a8;
  TextureGather2DInstance *local_488;
  TextureFormat local_480;
  long *local_478 [2];
  long local_468 [2];
  long *local_458 [2];
  long local_448 [2];
  Sampler local_438;
  LogImage local_3f8;
  TextureFormatInfo local_368;
  undefined8 local_328 [14];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [384];
  
  TVar1 = *(TextureFormat *)(**(long **)(in_RSI + 8) + 0x10);
  local_488 = this;
  tcu::getTextureFormatInfo(&local_368,(TextureFormat *)(in_RSI + 0x218));
  pTVar5 = (Texture2D *)operator_new(0x50);
  tcu::Texture2D::Texture2D
            (pTVar5,(TextureFormat *)(in_RSI + 0x218),*(int *)(in_RSI + 0x264),
             *(int *)(in_RSI + 0x268));
  local_438.compare = *(CompareMode *)(in_RSI + 0x220);
  local_438._0_8_ = *(undefined8 *)(in_RSI + 0x224);
  local_438.wrapR = REPEAT_GL;
  local_438._12_8_ = *(undefined8 *)(in_RSI + 0x240);
  local_438.lodThreshold = 0.0;
  local_438.normalizedCoords = true;
  local_438.depthStencilMode = MODE_DEPTH;
  local_438._32_8_ = 0;
  local_438.borderColor.v._4_5_ = 0;
  local_438.borderColor.v.uData[2]._1_3_ = 0;
  local_438._48_5_ = 0;
  levelNdx = *(int *)(in_RSI + 0x248);
  iVar4 = (int)((ulong)((long)(pTVar5->super_TextureLevelPyramid).m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar5->super_TextureLevelPyramid).m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_4cc = iVar4 * -0x33333333;
  local_4e0.m_data.ptr = pTVar5;
  if (SBORROW4(levelNdx,local_4cc) != levelNdx + iVar4 * 0x33333333 < 0) {
    lVar11 = (long)levelNdx * 0x28;
    local_480 = TVar1;
    do {
      tcu::Texture2D::allocLevel(local_4e0.m_data.ptr,levelNdx);
      pPVar7 = ((local_4e0.m_data.ptr)->super_TextureLevelPyramid).m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      seed = tcu::CommandLine::getBaseSeed(*(CommandLine **)(**(long **)(in_RSI + 8) + 0x18));
      access = (ConstPixelBufferAccess *)
               ((long)(pPVar7->super_ConstPixelBufferAccess).m_size.m_data + lVar11 + -8);
      fillWithRandomColorTiles
                ((PixelBufferAccess *)access,&local_368.valueMin,&local_368.valueMax,seed);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      std::ostream::operator<<((ostringstream *)local_328,levelNdx);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
      std::ios_base::~ios_base(local_2b8);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_458,0,(char *)0x0,0xb28ecf);
      local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_4a8.field_2._M_allocated_capacity = *psVar9;
        local_4a8.field_2._8_8_ = plVar6[3];
      }
      else {
        local_4a8.field_2._M_allocated_capacity = *psVar9;
        local_4a8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_4a8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      std::ostream::operator<<((ostringstream *)local_328,levelNdx);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
      std::ios_base::~ios_base(local_2b8);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_478,0,(char *)0x0,0xb28ee1);
      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_4c8.field_2._M_allocated_capacity = *psVar9;
        local_4c8.field_2._8_8_ = plVar6[3];
      }
      else {
        local_4c8.field_2._M_allocated_capacity = *psVar9;
        local_4c8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_4c8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      tcu::LogImage::LogImage
                (&local_3f8,&local_4a8,&local_4c8,access,QP_IMAGE_COMPRESSION_MODE_BEST);
      TVar1 = local_480;
      tcu::LogImage::write(&local_3f8,local_480.order,__buf,(size_t)access);
      TVar3 = local_480;
      this_00 = (ostringstream *)(local_1b0 + 8);
      local_480.order = TVar1.order;
      local_480.type = TVar1.type;
      local_1b0._0_4_ = local_480.order;
      local_1b0._4_4_ = local_480.type;
      local_480 = TVar3;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Note: texture level\'s size is ",0x1e);
      local_328[0] = *(undefined8 *)
                      ((long)(pPVar7->super_ConstPixelBufferAccess).m_size.m_data + lVar11);
      tcu::operator<<((ostream *)this_00,(Vector<int,_2> *)local_328);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8.m_description._M_dataplus._M_p != &local_3f8.m_description.field_2) {
        operator_delete(local_3f8.m_description._M_dataplus._M_p,
                        local_3f8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8.m_name._M_dataplus._M_p != &local_3f8.m_name.field_2) {
        operator_delete(local_3f8.m_name._M_dataplus._M_p,
                        local_3f8.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
      }
      if (local_478[0] != local_468) {
        operator_delete(local_478[0],local_468[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
        operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
      }
      if (local_458[0] != local_448) {
        operator_delete(local_458[0],local_448[0] + 1);
      }
      lVar11 = lVar11 + 0x28;
      levelNdx = levelNdx + 1;
    } while (local_4cc != levelNdx);
  }
  pTVar5 = local_4e0.m_data.ptr;
  tcu::Texture2D::Texture2D
            ((Texture2D *)local_1b0,(TextureFormat *)local_4e0.m_data.ptr,
             (local_4e0.m_data.ptr)->m_width,(local_4e0.m_data.ptr)->m_height);
  tcu::Texture2D::operator=((Texture2D *)(in_RSI + 0x288),(Texture2D *)local_1b0);
  tcu::Texture3D::~Texture3D((Texture3D *)local_1b0);
  pPVar7 = (pTVar5->super_TextureLevelPyramid).m_access.
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar10 = (pTVar5->super_TextureLevelPyramid).m_access.
            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pPVar10 - (long)pPVar7) >> 3) * -0x33333333) {
    lVar13 = 8;
    lVar11 = 0;
    lVar12 = 0;
    do {
      if (*(long *)((long)&((pTVar5->super_TextureLevelPyramid).m_data.
                            super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar13) != 0) {
        tcu::Texture2D::allocLevel((Texture2D *)(in_RSI + 0x288),(int)lVar12);
        swizzlePixels((PixelBufferAccess *)(*(long *)(in_RSI + 0x2a8) + lVar11),
                      (ConstPixelBufferAccess *)
                      ((long)(((pTVar5->super_TextureLevelPyramid).m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess).m_size.m_data + lVar11 + -8),
                      (MaybeTextureSwizzle *)(in_RSI + 0x22c));
        pPVar7 = (pTVar5->super_TextureLevelPyramid).m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar10 = (pTVar5->super_TextureLevelPyramid).m_access.
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x28;
      lVar13 = lVar13 + 0x10;
    } while (lVar12 < (int)((ulong)((long)pPVar10 - (long)pPVar7) >> 3) * -0x33333333);
  }
  this_01 = (TextureBinding *)operator_new(0x68);
  pTVar5 = local_4e0.m_data.ptr;
  local_4e0.m_data.ptr = (Texture2D *)0x0;
  TextureBinding::TextureBinding(this_01,pTVar5,&local_438);
  pTVar2 = local_488;
  (local_488->super_TextureGatherInstance).super_ShaderRenderCaseInstance.super_TestInstance.
  m_context = (Context *)0x0;
  (local_488->super_TextureGatherInstance).super_ShaderRenderCaseInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)this_01;
  pCVar8 = (Context *)operator_new(0x20);
  *(undefined4 *)&pCVar8->m_platformInterface = 0;
  *(undefined4 *)((long)&pCVar8->m_platformInterface + 4) = 0;
  pCVar8->m_testCtx = (TestContext *)&PTR__SharedPtrState_00d2bfc0;
  pCVar8->m_progCollection = (ProgramCollection<vk::ProgramBinary> *)this_01;
  (pTVar2->super_TextureGatherInstance).super_ShaderRenderCaseInstance.super_TestInstance.m_context
       = pCVar8;
  *(undefined4 *)&pCVar8->m_platformInterface = 1;
  *(undefined4 *)((long)&pCVar8->m_platformInterface + 4) = 1;
  de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::reset(&local_4e0);
  TVar14.m_state = extraout_RDX;
  TVar14.m_ptr = (TextureBinding *)pTVar2;
  return TVar14;
}

Assistant:

TextureBindingSp TextureGather2DInstance::createTexture (void)
{
	TestLog&						log			= m_context.getTestContext().getLog();
	const tcu::TextureFormatInfo	texFmtInfo	= tcu::getTextureFormatInfo(m_baseParams.textureFormat);
	MovePtr<tcu::Texture2D>			texture		= MovePtr<tcu::Texture2D>(new tcu::Texture2D(m_baseParams.textureFormat, m_textureSize.x(), m_textureSize.y()));
	const tcu::Sampler				sampler		(m_baseParams.wrapS, m_baseParams.wrapT, tcu::Sampler::REPEAT_GL,
												 m_baseParams.minFilter, m_baseParams.magFilter,
												 0.0f /* LOD threshold */, true /* normalized coords */, m_baseParams.shadowCompareMode);

	{
		const int	levelBegin	= m_baseParams.baseLevel;
		const int	levelEnd	= texture->getNumLevels();
		DE_ASSERT(m_baseParams.baseLevel < texture->getNumLevels());

		for (int levelNdx = levelBegin; levelNdx < levelEnd; levelNdx++)
		{
			texture->allocLevel(levelNdx);
			const PixelBufferAccess& level = texture->getLevel(levelNdx);
			fillWithRandomColorTiles(level, texFmtInfo.valueMin, texFmtInfo.valueMax, (deUint32)m_context.getTestContext().getCommandLine().getBaseSeed());
			log << TestLog::Image("InputTextureLevel" + de::toString(levelNdx), "Input texture, level " + de::toString(levelNdx), level)
				<< TestLog::Message << "Note: texture level's size is " << IVec2(level.getWidth(), level.getHeight()) << TestLog::EndMessage;
		}

		swizzleTexture(m_swizzledTexture, *texture, m_baseParams.textureSwizzle);
	}

	return TextureBindingSp(new TextureBinding(texture.release(), sampler));
}